

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::setVisibleHelper
          (QGraphicsItemPrivate *this,bool newVisible,bool explicitly,bool update,bool hiddenByPanel
          )

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  WindowType WVar5;
  Int IVar6;
  QGraphicsItemPrivate *pQVar7;
  QGraphicsItem **ppQVar8;
  QGraphicsItem *pQVar9;
  QGraphicsItem *pQVar10;
  byte in_CL;
  byte bVar11;
  byte in_DL;
  byte bVar12;
  byte in_SIL;
  byte bVar13;
  QGraphicsItemPrivate *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QGraphicsItem *p_1;
  QGraphicsItem *fi;
  QGraphicsItem *fsi;
  bool done;
  QGraphicsItem *p;
  QGraphicsItem *child;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  bool updateChildren;
  QGraphicsWidget *widget;
  bool clear;
  QGraphicsItem *focusItem;
  bool hasFocus;
  QGraphicsItemCache *c;
  const_iterator __end1;
  const_iterator __begin1;
  QGraphicsItem *q;
  QVariant newVisibleVariant;
  undefined4 in_stack_fffffffffffffe18;
  FocusReason in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  FocusReason in_stack_fffffffffffffe24;
  QGraphicsItem *in_stack_fffffffffffffe28;
  QGraphicsItemPrivate *in_stack_fffffffffffffe30;
  QGraphicsItem *in_stack_fffffffffffffe38;
  QGraphicsItem *in_stack_fffffffffffffe40;
  undefined5 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4d;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  QGraphicsScenePrivate *this_00;
  undefined8 in_stack_fffffffffffffe58;
  PanelModality previousModality;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  byte bVar14;
  QGraphicsWidget *in_stack_fffffffffffffe68;
  QGraphicsItemPrivate *in_stack_fffffffffffffe70;
  QGraphicsItem *in_stack_fffffffffffffe78;
  QGraphicsScenePrivate *in_stack_fffffffffffffe80;
  QGraphicsItem *local_150;
  QGraphicsItem *local_140;
  QGraphicsItem *local_130;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  byte bVar15;
  QGraphicsItemPrivate *local_100;
  void *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_d4;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_d0;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_cc;
  QGraphicsItem **local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  QRectF local_b0;
  QGraphicsItem *local_90;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  previousModality = (PanelModality)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar13 = in_SIL & 1;
  bVar12 = in_DL & 1;
  bVar11 = in_CL & 1;
  bVar1 = in_R8B & 1;
  local_90 = q_func(in_RDI);
  if ((bVar12 & 1) != 0) {
    *(ulong *)&in_RDI->field_0x160 =
         *(ulong *)&in_RDI->field_0x160 & 0xffffffffffffffbf | (ulong)((bVar13 & 1) == 0) << 6;
  }
  if ((((uint)(*(ulong *)&in_RDI->field_0x160 >> 5) & 1) != (uint)(bVar13 & 1)) &&
     (((in_RDI->parent == (QGraphicsItem *)0x0 || ((bVar13 & 1) == 0)) ||
      (pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
                operator->(&in_RDI->parent->d_ptr), (*(ulong *)&pQVar7->field_0x160 >> 5 & 1) != 0))
     )) {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar10 = in_RDI->q_ptr;
    ::QVariant::QVariant(&local_48,(uint)(bVar13 & 1));
    (*pQVar10->_vptr_QGraphicsItem[0x21])(&local_28,pQVar10,2,&local_48);
    ::QVariant::~QVariant(&local_48);
    bVar13 = ::QVariant::toBool();
    bVar13 = bVar13 & 1;
    if (((uint)(*(ulong *)&in_RDI->field_0x160 >> 5) & 1) != (uint)bVar13) {
      *(ulong *)&in_RDI->field_0x160 =
           *(ulong *)&in_RDI->field_0x160 & 0xffffffffffffffdf | (ulong)bVar13 << 5;
      if ((bVar11 & 1) != 0) {
        extra((QGraphicsItemPrivate *)
              CONCAT17(in_stack_fffffffffffffe4f,
                       CONCAT16(in_stack_fffffffffffffe4e,
                                CONCAT15(in_stack_fffffffffffffe4d,in_stack_fffffffffffffe48))),
              (Extra)((ulong)in_stack_fffffffffffffe40 >> 0x20));
        in_stack_ffffffffffffff10 =
             qvariant_cast<void*>
                       ((QVariant *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        ::QVariant::~QVariant(&local_68);
        if (in_stack_ffffffffffffff10 != (void *)0x0) {
          QGraphicsItemCache::purge((QGraphicsItemCache *)in_stack_fffffffffffffe30);
        }
        if (in_RDI->scene != (QGraphicsScene *)0x0) {
          invalidateParentGraphicsEffectsRecursively
                    ((QGraphicsItemPrivate *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          QGraphicsScene::d_func((QGraphicsScene *)0x97466b);
          QRectF::QRectF(&local_b0);
          in_stack_fffffffffffffe18 = 0;
          in_stack_fffffffffffffe20 = 0;
          QGraphicsScenePrivate::markDirty
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     (QRectF *)in_stack_fffffffffffffe70,
                     SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffe68 >> 0x30,0),
                     SUB81((ulong)in_stack_fffffffffffffe68 >> 0x28,0),
                     SUB81((ulong)in_stack_fffffffffffffe68 >> 0x20,0),
                     SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0));
        }
      }
      bVar2 = QGraphicsItem::hasFocus(in_stack_fffffffffffffe28);
      if ((bVar13 & 1) == 0) {
        if (in_RDI->scene != (QGraphicsScene *)0x0) {
          QGraphicsScene::d_func((QGraphicsScene *)0x97471d);
          bVar3 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                            ((QListSpecialMethodsBase<QGraphicsItem_*> *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             (QGraphicsItem **)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          if (bVar3) {
            QGraphicsItem::ungrabMouse
                      ((QGraphicsItem *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          }
          QGraphicsScene::d_func((QGraphicsScene *)0x97475b);
          bVar3 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                            ((QListSpecialMethodsBase<QGraphicsItem_*> *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             (QGraphicsItem **)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          if (bVar3) {
            QGraphicsItem::ungrabKeyboard
                      ((QGraphicsItem *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          }
          bVar3 = QGraphicsItem::isPanel((QGraphicsItem *)0x974792);
          if ((bVar3) && (in_RDI->panelModality != NonModal)) {
            QGraphicsScene::d_func((QGraphicsScene *)0x9747bd);
            QGraphicsScenePrivate::leaveModal
                      ((QGraphicsScenePrivate *)
                       CONCAT17(in_stack_fffffffffffffe4f,
                                CONCAT16(in_stack_fffffffffffffe4e,
                                         CONCAT15(in_stack_fffffffffffffe4d,
                                                  in_stack_fffffffffffffe48))),
                       (QGraphicsItem *)
                       CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
          }
        }
        if ((bVar2) && (in_RDI->scene != (QGraphicsScene *)0x0)) {
          local_100 = (QGraphicsItemPrivate *)
                      QGraphicsScene::focusItem((QGraphicsScene *)in_stack_fffffffffffffe30);
          bVar15 = 1;
          if (((*(ulong *)&in_RDI->field_0x160 >> 0x18 & 1) != 0) &&
             (bVar3 = QGraphicsItem::isPanel((QGraphicsItem *)0x97484e), !bVar3)) {
            do {
              if (local_100 == (QGraphicsItemPrivate *)in_RDI->q_ptr) {
                if (in_RDI->q_ptr == (QGraphicsItem *)0x0) {
                  pQVar10 = (QGraphicsItem *)0x0;
                }
                else {
                  pQVar10 = in_RDI->q_ptr + -1;
                }
                iVar4 = (*pQVar10->_vptr_QGraphicsItem[0x1e])(pQVar10,1);
                bVar15 = ((byte)iVar4 ^ 0xff) & 1;
                break;
              }
              in_stack_fffffffffffffe68 = QGraphicsItem::parentWidget(in_stack_fffffffffffffe40);
              local_100 = (QGraphicsItemPrivate *)0x0;
              if (in_stack_fffffffffffffe68 != (QGraphicsWidget *)0x0) {
                local_100 = (QGraphicsItemPrivate *)
                            &(in_stack_fffffffffffffe68->super_QGraphicsObject).super_QGraphicsItem;
              }
              bVar14 = 0;
              in_stack_fffffffffffffe70 = local_100;
              if (local_100 != (QGraphicsItemPrivate *)0x0) {
                bVar3 = QGraphicsItem::isPanel((QGraphicsItem *)0x97491c);
                bVar14 = bVar3 ^ 0xff;
              }
            } while ((bVar14 & 1) != 0);
          }
          if ((bVar15 & 1) != 0) {
            clearFocusHelper(in_stack_fffffffffffffe30,
                             SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0),
                             SUB81((ulong)in_stack_fffffffffffffe28 >> 0x30,0));
          }
        }
        bVar3 = QGraphicsItem::isSelected(in_stack_fffffffffffffe28);
        if (bVar3) {
          QGraphicsItem::setSelected
                    (in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
        }
      }
      else {
        *(ulong *)&in_RDI->field_0x160 =
             *(ulong *)&in_RDI->field_0x160 & 0xffbfffffffffffff | 0x40000000000000;
        *(ulong *)&in_RDI->field_0x160 =
             *(ulong *)&in_RDI->field_0x160 & 0xffefffffffffffff | 0x10000000000000;
        if (in_RDI->scene != (QGraphicsScene *)0x0) {
          if ((*(ulong *)&in_RDI->field_0x160 >> 0x18 & 1) != 0) {
            pQVar10 = in_RDI->q_ptr;
            if (pQVar10 == (QGraphicsItem *)0x0) {
              this_00 = (QGraphicsScenePrivate *)0x0;
            }
            else {
              this_00 = (QGraphicsScenePrivate *)(pQVar10 + -1);
            }
            WVar5 = QGraphicsWidget::windowType
                              ((QGraphicsWidget *)
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
            previousModality = (PanelModality)((ulong)pQVar10 >> 0x20);
            if (WVar5 == Popup) {
              QGraphicsScene::d_func((QGraphicsScene *)0x974a6e);
              QGraphicsScenePrivate::addPopup
                        (this_00,(QGraphicsWidget *)
                                 CONCAT17(in_stack_fffffffffffffe4f,
                                          CONCAT16(in_stack_fffffffffffffe4e,
                                                   CONCAT15(in_stack_fffffffffffffe4d,
                                                            in_stack_fffffffffffffe48))));
            }
          }
          bVar3 = QGraphicsItem::isPanel((QGraphicsItem *)0x974a8d);
          if ((bVar3) && (in_RDI->panelModality != NonModal)) {
            QGraphicsScene::d_func((QGraphicsScene *)0x974ab8);
            QGraphicsScenePrivate::enterModal
                      ((QGraphicsScenePrivate *)
                       CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                       (QGraphicsItem *)
                       CONCAT17(bVar13,CONCAT16(bVar12,CONCAT15(bVar11,CONCAT14(bVar1,
                                                  in_stack_ffffffffffffff18)))),previousModality);
          }
        }
      }
      local_b8.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = QList<QGraphicsItem_*>::begin
                           ((QList<QGraphicsItem_*> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      local_c0.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_c0 = QList<QGraphicsItem_*>::end
                           ((QList<QGraphicsItem_*> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      while( true ) {
        local_c8 = local_c0.i;
        bVar3 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_b8,local_c0);
        if (!bVar3) break;
        ppQVar8 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_b8);
        pQVar10 = *ppQVar8;
        if (((bVar13 & 1) == 0) ||
           (pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&pQVar10->d_ptr), (*(ulong *)&pQVar7->field_0x160 >> 6 & 1) == 0))
        {
          QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
          operator->(&pQVar10->d_ptr);
          setVisibleHelper((QGraphicsItemPrivate *)
                           CONCAT17(bVar13,CONCAT16(bVar12,CONCAT15(bVar11,CONCAT14(bVar1,
                                                  in_stack_ffffffffffffff18)))),
                           SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),
                           SUB81((ulong)in_stack_ffffffffffffff10 >> 0x30,0),
                           SUB81((ulong)in_stack_ffffffffffffff10 >> 0x28,0),
                           SUB81((ulong)in_stack_ffffffffffffff10 >> 0x20,0));
        }
        QList<QGraphicsItem_*>::const_iterator::operator++(&local_b8);
      }
      if ((in_RDI->scene != (QGraphicsScene *)0x0) &&
         (bVar3 = QGraphicsItem::isPanel((QGraphicsItem *)0x974cd9), bVar3)) {
        if ((bVar13 & 1) == 0) {
          bVar3 = QGraphicsItem::isActive(in_stack_fffffffffffffe28);
          if (bVar3) {
            QGraphicsScene::setActivePanel
                      ((QGraphicsScene *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (QGraphicsItem *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          }
        }
        else if ((in_RDI->parent != (QGraphicsItem *)0x0) &&
                (bVar3 = QGraphicsItem::isActive(in_stack_fffffffffffffe28), bVar3)) {
          QGraphicsItem::setActive
                    (in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
        }
      }
      if (in_RDI->scene != (QGraphicsScene *)0x0) {
        if ((bVar13 & 1) == 0) {
          if (bVar2) {
            local_150 = in_RDI->parent;
            while (local_150 != (QGraphicsItem *)0x0) {
              QGraphicsItem::flags
                        ((QGraphicsItem *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
              local_d4.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
                   (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
                   QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                             ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe1c);
              IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d4);
              if (IVar6 != 0) {
                pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         ::operator->(&local_150->d_ptr);
                if ((*(ulong *)&pQVar7->field_0x160 >> 5 & 1) != 0) {
                  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  ::operator->(&local_150->d_ptr);
                  setFocusHelper(in_stack_fffffffffffffe70,
                                 (FocusReason)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0),
                                 SUB81((ulong)in_stack_fffffffffffffe68 >> 0x10,0));
                }
                break;
              }
              pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       ::operator->(&local_150->d_ptr);
              local_150 = pQVar7->parent;
            }
          }
        }
        else {
          bVar2 = false;
          local_130 = in_RDI->parent;
          while (local_130 != (QGraphicsItem *)0x0) {
            local_d0.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
                 (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
                 QGraphicsItem::flags
                           ((QGraphicsItem *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
            local_cc.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
                 (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
                 QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                           ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            in_stack_fffffffffffffe1c);
            IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_cc);
            if (IVar6 != 0) {
              pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       ::operator->(&local_130->d_ptr);
              local_140 = pQVar7->focusScopeItem;
              if ((in_RDI->q_ptr == local_140) ||
                 (bVar3 = QGraphicsItem::isAncestorOf
                                    (in_stack_fffffffffffffe38,
                                     (QGraphicsItem *)in_stack_fffffffffffffe30), bVar3)) {
                bVar2 = true;
                while( true ) {
                  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           ::operator->(&local_140->d_ptr);
                  bVar3 = false;
                  if (pQVar7->focusScopeItem != (QGraphicsItem *)0x0) {
                    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    ::operator->(&local_140->d_ptr);
                    bVar3 = QGraphicsItem::isVisible((QGraphicsItem *)0x974e9a);
                  }
                  if (bVar3 == false) break;
                  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           ::operator->(&local_140->d_ptr);
                  local_140 = pQVar7->focusScopeItem;
                }
                QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
                operator->(&local_140->d_ptr);
                setFocusHelper(in_stack_fffffffffffffe70,
                               (FocusReason)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0),
                               SUB81((ulong)in_stack_fffffffffffffe68 >> 0x10,0));
              }
              break;
            }
            pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&local_130->d_ptr);
            local_130 = pQVar7->parent;
          }
          if (!bVar2) {
            pQVar10 = in_RDI->subFocusItem;
            if ((pQVar10 == (QGraphicsItem *)0x0) ||
               (pQVar9 = QGraphicsScene::focusItem((QGraphicsScene *)in_stack_fffffffffffffe30),
               pQVar10 == pQVar9)) {
              if (((*(ulong *)&in_RDI->field_0x160 & 0x800000000000) != 0) &&
                 (pQVar10 = QGraphicsScene::focusItem((QGraphicsScene *)in_stack_fffffffffffffe30),
                 pQVar10 == (QGraphicsItem *)0x0)) {
                pQVar10 = local_90;
                QGraphicsScene::d_func((QGraphicsScene *)0x974ff8);
                bVar2 = QGraphicsItem::isAncestorOf
                                  (pQVar10,(QGraphicsItem *)in_stack_fffffffffffffe30);
                if (bVar2) {
                  QGraphicsItem::setFocus
                            ((QGraphicsItem *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             in_stack_fffffffffffffe1c);
                }
              }
            }
            else {
              QGraphicsScene::setFocusItem
                        ((QGraphicsScene *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe24);
            }
          }
        }
      }
      (*in_RDI->q_ptr->_vptr_QGraphicsItem[0x21])(&local_88,in_RDI->q_ptr,0xc,&local_28);
      ::QVariant::~QVariant(&local_88);
      if ((*(ulong *)&in_RDI->field_0x160 >> 0x38 & 1) != 0) {
        QGraphicsObject::visibleChanged((QGraphicsObject *)0x9751ae);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setVisibleHelper(bool newVisible, bool explicitly,
                                            bool update, bool hiddenByPanel)
{
    Q_Q(QGraphicsItem);

    // Update explicit bit.
    if (explicitly)
        explicitlyHidden = newVisible ? 0 : 1;

    // Check if there's nothing to do.
    if (visible == quint32(newVisible))
        return;

    // Don't show child if parent is not visible
    if (parent && newVisible && !parent->d_ptr->visible)
        return;

    // Modify the property.
    const QVariant newVisibleVariant(q_ptr->itemChange(QGraphicsItem::ItemVisibleChange,
                                                       quint32(newVisible)));
    newVisible = newVisibleVariant.toBool();
    if (visible == quint32(newVisible))
        return;
    visible = newVisible;

    // Schedule redrawing
    if (update) {
        QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
        if (c)
            c->purge();
        if (scene) {
#if QT_CONFIG(graphicseffect)
            invalidateParentGraphicsEffectsRecursively();
#endif // QT_CONFIG(graphicseffect)
            scene->d_func()->markDirty(q_ptr, QRectF(), /*invalidateChildren=*/false, /*force=*/true);
        }
    }

    // Certain properties are dropped as an item becomes invisible.
    bool hasFocus = q_ptr->hasFocus();
    if (!newVisible) {
        if (scene) {
            if (scene->d_func()->mouseGrabberItems.contains(q))
                q->ungrabMouse();
            if (scene->d_func()->keyboardGrabberItems.contains(q))
                q->ungrabKeyboard();
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal)
                scene->d_func()->leaveModal(q_ptr);
        }
        if (hasFocus && scene) {
            // Hiding the focus item or the closest non-panel ancestor of the focus item
            QGraphicsItem *focusItem = scene->focusItem();
            bool clear = true;
            if (isWidget && !focusItem->isPanel()) {
                do {
                    if (focusItem == q_ptr) {
                        clear = !static_cast<QGraphicsWidget *>(q_ptr)->focusNextPrevChild(true);
                        break;
                    }
                } while ((focusItem = focusItem->parentWidget()) && !focusItem->isPanel());
            }
            if (clear)
                clearFocusHelper(/* giveFocusToParent = */ false, hiddenByPanel);
        }
        if (q_ptr->isSelected())
            q_ptr->setSelected(false);
    } else {
        geometryChanged = 1;
        paintedViewBoundingRectsNeedRepaint = 1;
        if (scene) {
            if (isWidget) {
                QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(q_ptr);
                if (widget->windowType() == Qt::Popup)
                    scene->d_func()->addPopup(widget);
            }
            if (q->isPanel() && panelModality != QGraphicsItem::NonModal) {
                scene->d_func()->enterModal(q_ptr);
            }
        }
    }

    // Update children with explicitly = false.
    const bool updateChildren = update && !((flags & QGraphicsItem::ItemClipsChildrenToShape
                                             || flags & QGraphicsItem::ItemContainsChildrenInShape)
                                            && !(flags & QGraphicsItem::ItemHasNoContents));
    for (QGraphicsItem *child : std::as_const(children)) {
        if (!newVisible || !child->d_ptr->explicitlyHidden)
            child->d_ptr->setVisibleHelper(newVisible, false, updateChildren, hiddenByPanel);
    }

    // Update activation
    if (scene && q->isPanel()) {
        if (newVisible) {
            if (parent && parent->isActive())
                q->setActive(true);
        } else {
            if (q->isActive())
                scene->setActivePanel(parent);
        }
    }

    // Enable subfocus
    if (scene) {
        if (newVisible) {
            // Item is shown
            QGraphicsItem *p = parent;
            bool done = false;
            while (p) {
                if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                    QGraphicsItem *fsi = p->d_ptr->focusScopeItem;
                    if (q_ptr == fsi || q_ptr->isAncestorOf(fsi)) {
                        done = true;
                        while (fsi->d_ptr->focusScopeItem && fsi->d_ptr->focusScopeItem->isVisible())
                            fsi = fsi->d_ptr->focusScopeItem;
                        fsi->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                   /* focusFromHide = */ false);
                    }
                    break;
                }
                p = p->d_ptr->parent;
            }
            if (!done) {
                QGraphicsItem *fi = subFocusItem;
                if (fi && fi != scene->focusItem()) {
                    scene->setFocusItem(fi);
                } else if (flags & QGraphicsItem::ItemIsFocusScope &&
                           !scene->focusItem() &&
                           q->isAncestorOf(scene->d_func()->lastFocusItem)) {
                    q_ptr->setFocus();
                }
            }
        } else {
            // Item is hidden
            if (hasFocus) {
                QGraphicsItem *p = parent;
                while (p) {
                    if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                        if (p->d_ptr->visible) {
                            p->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ true,
                                                     /* focusFromHide = */ true);
                        }
                        break;
                    }
                    p = p->d_ptr->parent;
                }
            }
        }
    }

    // Deliver post-change notification.
    q_ptr->itemChange(QGraphicsItem::ItemVisibleHasChanged, newVisibleVariant);

    if (isObject)
        emit static_cast<QGraphicsObject *>(q_ptr)->visibleChanged();
}